

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthStateMonitor.cpp
# Opt level: O3

void __thiscall PartVolumeButton::toggleSoloPart(PartVolumeButton *this,bool enabled)

{
  int iVar1;
  PartVolumeButton *this_00;
  int i;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    this_00 = this->monitor->partVolumeButton[uVar2];
    iVar1 = this_00->volume;
    if ((enabled) && (uVar2 != (uint)this->partNum)) {
      if (0 < iVar1) {
LAB_0015e7f7:
        toggleMutePart(this_00);
      }
    }
    else if (iVar1 < 1) goto LAB_0015e7f7;
    uVar2 = uVar2 + 1;
    if (uVar2 == 9) {
      return;
    }
  } while( true );
}

Assistant:

void PartVolumeButton::toggleSoloPart(bool enabled) {
	for (int i = 0; i < 9; i++) {
		if (enabled && i != partNum) {
			monitor.partVolumeButton[i]->mutePart();
		} else {
			monitor.partVolumeButton[i]->unmutePart();
		}
	}
}